

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O0

Impl<float> * BamTools::Variant::CastFromBase<float>(ImplBase *v)

{
  RuleToken *__rhs;
  char *__lhs;
  long in_RDI;
  Impl<float> *p;
  Impl<float> *local_78;
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  Impl<float> *local_10;
  
  if (in_RDI == 0) {
    local_78 = (Impl<float> *)0x0;
  }
  else {
    local_78 = (Impl<float> *)__dynamic_cast(in_RDI,&ImplBase::typeinfo,&Impl<float>::typeinfo,0);
  }
  local_10 = local_78;
  if (local_78 == (Impl<float> *)0x0) {
    __rhs = (RuleToken *)__cxa_allocate_exception(0x10);
    __lhs = std::type_info::name((type_info *)&float::typeinfo);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50," is not a valid type",&local_51);
    std::operator+(__lhs,__rhs);
    std::invalid_argument::invalid_argument((invalid_argument *)__rhs,local_30);
    __cxa_throw(__rhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return local_78;
}

Assistant:

static Impl<T>* CastFromBase(ImplBase* v)
    {
        // This upcast will fail if T is other than the T used
        // with the constructor of variant_t.
        Impl<T>* p = dynamic_cast<Impl<T>*>(v);
        if (p == NULL)
            throw std::invalid_argument(typeid(T).name() + std::string(" is not a valid type"));
        return p;
    }